

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,bool implib)

{
  bool bVar1;
  OutputInfo *local_90;
  allocator local_61;
  OutputInfo *local_60;
  OutputInfo *info;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool implib_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_21 = implib;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  bVar1 = IsImported(this);
  if (bVar1) {
    cmTarget::ImportedGetFullPath(&local_48,this->Target,psStack_20,(bool)(local_21 & 1));
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    local_60 = GetOutputInfo(this,psStack_20);
    if (local_60 == (OutputInfo *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_61);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
    else {
      local_90 = local_60;
      if ((local_21 & 1) != 0) {
        local_90 = (OutputInfo *)&local_60->ImpDir;
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_90);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetDirectory(const std::string& config,
                                   bool implib) const
{
  if (this->IsImported())
    {
    // Return the directory from which the target is imported.
    return
      cmSystemTools::GetFilenamePath(
      this->Target->ImportedGetFullPath(config, implib));
    }
  else if(OutputInfo const* info = this->GetOutputInfo(config))
    {
    // Return the directory in which the target will be built.
    return implib? info->ImpDir : info->OutDir;
    }
  return "";
}